

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void QSslSocketPrivate::setDefaultCiphers(QList<QSslCipher> *ciphers)

{
  long lVar1;
  QMutexLocker<QMutex> *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *this;
  QMutexLocker<QMutex> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
         &globalData;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
             &globalData);
  QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffffd0,(QMutex *)this);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()(this);
  QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach
            ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)in_stack_ffffffffffffffd0);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()(this);
  QExplicitlySharedDataPointer<QSslConfigurationPrivate>::operator->
            ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)0x3a556d);
  QList<QSslCipher>::operator=((QList<QSslCipher> *)in_RDI,(QList<QSslCipher> *)this);
  QMutexLocker<QMutex>::~QMutexLocker(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::setDefaultCiphers(const QList<QSslCipher> &ciphers)
{
    QMutexLocker locker(&globalData()->mutex);
    globalData()->config.detach();
    globalData()->config->ciphers = ciphers;
}